

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::CreateBufferTexture<unsigned_char,3,true>
          (BufferTest *this,bool use_range_version)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  ostringstream *this_00;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  char *pcVar6;
  ulong uVar7;
  GLint alignment;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pGVar1 = &this->m_to;
  (**(code **)(lVar5 + 0x6f8))(1,pGVar1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x34c);
  (**(code **)(lVar5 + 0xb8))(0x8c2a,this->m_to);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x34f);
  pGVar2 = &this->m_bo;
  (**(code **)(lVar5 + 0x6c8))(1,pGVar2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x352);
  (**(code **)(lVar5 + 0x40))(0x8c2a,this->m_bo);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x355);
  if ((int)CONCAT71(in_register_00000031,use_range_version) == 0) {
    (**(code **)(lVar5 + 0x150))(0x8c2a,0x12,"",0x88e4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glNamedBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x36d);
    (**(code **)(lVar5 + 0x13d8))(*pGVar1,0x8051,*pGVar2);
  }
  else {
    local_1b0._0_4_ = 1;
    (**(code **)(lVar5 + 0x868))(0x919f,local_1b0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x35d);
    uVar7 = local_1b0._0_8_ & 0xffffffff;
    (**(code **)(lVar5 + 0x150))(0x8c2a,local_1b0._0_4_ + 0x12,0,0x88e4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBufferData has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x363);
    (**(code **)(lVar5 + 0x168))(0x8c2a,uVar7,0x12,"");
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBufferSubdata has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x366);
    (**(code **)(lVar5 + 0x13e0))(*pGVar1,0x8051,*pGVar2,uVar7,0x12);
  }
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar6 = "glTextureBuffer";
    if (use_range_version) {
      pcVar6 = "glTextureBufferRange";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar6,(ulong)use_range_version * 5 + 0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," unexpectedly generated error ",0x1e);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," during test of internal format ",0x20);
    local_1d0.m_getName = glu::getTextureFormatName;
    local_1d0.m_value = 0x8051;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    CleanBufferTexture(this);
  }
  return iVar3 == 0;
}

Assistant:

bool BufferTest::CreateBufferTexture(bool use_range_version)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_BUFFER, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.genBuffers(1, &m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers has failed");

	gl.bindBuffer(GL_TEXTURE_BUFFER, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer has failed");

	/* Data setup. */
	if (use_range_version)
	{
		glw::GLint alignment = 1;

		gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &alignment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		const glw::GLuint b_offset = alignment;
		const glw::GLuint b_size   = TestReferenceDataSize<T, S>() + b_offset;

		gl.bufferData(GL_TEXTURE_BUFFER, b_size, NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData has failed");

		gl.bufferSubData(GL_TEXTURE_BUFFER, b_offset, TestReferenceDataSize<T, S>(), ReferenceData<T, N>());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubdata has failed");

		gl.textureBufferRange(m_to, InternalFormat<T, S, N>(), m_bo, b_offset, TestReferenceDataSize<T, S>());
	}
	else
	{
		gl.bufferData(GL_TEXTURE_BUFFER, TestReferenceDataSize<T, S>(), ReferenceData<T, N>(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData has failed");

		gl.textureBuffer(m_to, InternalFormat<T, S, N>(), m_bo);
	}

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << (use_range_version ? ("glTextureBufferRange") : ("glTextureBuffer"))
			<< " unexpectedly generated error " << glu::getErrorStr(error) << " during test of internal format "
			<< glu::getTextureFormatStr(InternalFormat<T, S, N>()) << "." << tcu::TestLog::EndMessage;

		CleanBufferTexture();

		return false;
	}

	return true;
}